

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-time-dependent.cpp
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
DummyClass<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::fun
          (DummyClass<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *res,int t)

{
  _List_node_base *p_Var1;
  string sStack_48;
  
  this->call = this->call + 1;
  this->timedata = t;
  p_Var1 = (_List_node_base *)&this->inputsig;
  while (p_Var1 = (((_List_base<dynamicgraph::SignalTimeDependent<double,_int>_*,_std::allocator<dynamicgraph::SignalTimeDependent<double,_int>_*>_>
                     *)&p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var1 != (_List_node_base *)&this->inputsig) {
    (**(code **)(*(long *)p_Var1[1]._M_next + 0x20))(p_Var1[1]._M_next,&this->timedata);
  }
  p_Var1 = (_List_node_base *)&this->inputsigV;
  while (p_Var1 = (((_List_base<dynamicgraph::SignalTimeDependent<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_*,_std::allocator<dynamicgraph::SignalTimeDependent<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_*>_>
                     *)&p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var1 != (_List_node_base *)&this->inputsigV) {
    (**(code **)(*(long *)p_Var1[1]._M_next + 0x20))(p_Var1[1]._M_next,&this->timedata);
  }
  operator()(&sStack_48,this);
  std::__cxx11::string::operator=((string *)res,(string *)&sStack_48);
  std::__cxx11::string::~string((string *)&sStack_48);
  return res;
}

Assistant:

T &fun(T &res, int t) {
    ++call;
    timedata = t;

    BOOST_FOREACH (sigDouble_t *ptr, inputsig) ptr->access(timedata);

    BOOST_FOREACH (sigString_t *ptr, inputsigV) ptr->access(timedata);

    res = (*this)();
    return res;
  }